

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

void add_test_to_context(TestSuite *parent,ContextSuite **context_suites,TestItem *test_item,
                        CgreenTest *test)

{
  ContextSuite *pCVar1;
  char *__s2;
  int iVar2;
  ContextSuite *pCVar3;
  char *pcVar4;
  TestSuite *pTVar5;
  
  pCVar1 = *context_suites;
  __s2 = test_item->context_name;
  if (pCVar1 == (ContextSuite *)0x0) {
    pTVar5 = (TestSuite *)0x0;
  }
  else {
    pTVar5 = (TestSuite *)0x0;
    pCVar3 = pCVar1;
    do {
      iVar2 = strcmp(pCVar3->context_name,__s2);
      if (iVar2 == 0) {
        pTVar5 = pCVar3->suite;
        break;
      }
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (ContextSuite *)0x0);
  }
  if (pTVar5 == (TestSuite *)0x0) {
    pCVar3 = (ContextSuite *)calloc(1,0x18);
    pcVar4 = (char *)string_dup(__s2);
    pCVar3->context_name = pcVar4;
    pTVar5 = (TestSuite *)
             create_named_test_suite_
                       (__s2,
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                        ,0x6d);
    pCVar3->suite = pTVar5;
    pCVar3->next = pCVar1;
    add_suite_(parent,__s2,pTVar5);
    *context_suites = pCVar3;
    pTVar5 = pCVar3->suite;
  }
  add_test_(pTVar5,test_item->test_name,test);
  return;
}

Assistant:

static void add_test_to_context(TestSuite *parent, ContextSuite **context_suites,
                                TestItem *test_item, CgreenTest *test) {
    TestSuite *suite_for_context = find_suite_for_context(*context_suites, test_item->context_name);

    if (suite_for_context == NULL) {
        *context_suites = add_new_context_suite(parent, test_item->context_name, *context_suites);
        suite_for_context = (*context_suites)->suite;
    }
    add_test_(suite_for_context, test_item->test_name, test);
}